

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_AES_PDF.hh
# Opt level: O0

void __thiscall Pl_AES_PDF::~Pl_AES_PDF(Pl_AES_PDF *this)

{
  Pl_AES_PDF *this_local;
  
  ~Pl_AES_PDF(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

~Pl_AES_PDF() final = default;